

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_iterator.hpp
# Opt level: O2

bool __thiscall
boost::unit_test::utils::
token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,boost::unit_test::utils::ut_detail::default_char_compare<char>>,char,boost::unit_test::utils::ut_detail::default_char_compare<char>,boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>,boost::iterators::forward_traversal_tag>
::get<char_const*>(token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,boost::unit_test::utils::ut_detail::default_char_compare<char>>,char,boost::unit_test::utils::ut_detail::default_char_compare<char>,boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>,boost::iterators::forward_traversal_tag>
                   *this,char **begin,char *end)

{
  token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,boost::unit_test::utils::ut_detail::default_char_compare<char>>,char,boost::unit_test::utils::ut_detail::default_char_compare<char>,boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>,boost::iterators::forward_traversal_tag>
  tVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  
  *(undefined8 *)(this + 8) = *(undefined8 *)(this + 0x10);
  if (this[0x48] ==
      (token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,boost::unit_test::utils::ut_detail::default_char_compare<char>>,char,boost::unit_test::utils::ut_detail::default_char_compare<char>,boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>,boost::iterators::forward_traversal_tag>
       )0x0) {
    pcVar4 = *begin;
    while (pcVar4 != end) {
      bVar2 = ut_detail::
              delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>::
              operator()((delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                          *)(this + 0x18),*pcVar4);
      pcVar4 = *begin;
      if (!bVar2) break;
      pcVar4 = pcVar4 + 1;
      *begin = pcVar4;
    }
    if (pcVar4 == end) {
      return false;
    }
    pcVar3 = pcVar4;
    if (*(long *)(this + 0x50) == 1) {
      while (pcVar3 != end) {
        *begin = pcVar3 + 1;
        pcVar3 = pcVar3 + 1;
      }
    }
    else {
      bVar2 = ut_detail::
              delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>::
              operator()((delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                          *)(this + 0x30),*pcVar4);
      pcVar3 = *begin;
      if (bVar2) {
        *begin = pcVar3 + 1;
      }
      else {
        while (((pcVar3 != end &&
                (bVar2 = ut_detail::
                         delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                         ::operator()((delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                                       *)(this + 0x18),*pcVar3), !bVar2)) &&
               (bVar2 = ut_detail::
                        delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                        ::operator()((delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                                      *)(this + 0x30),**begin), !bVar2))) {
          pcVar3 = *begin + 1;
          *begin = pcVar3;
        }
      }
    }
    *(long *)(this + 0x50) = *(long *)(this + 0x50) + -1;
  }
  else {
    pcVar4 = *begin;
    if (pcVar4 == end) {
      if (this[0x58] !=
          (token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,boost::unit_test::utils::ut_detail::default_char_compare<char>>,char,boost::unit_test::utils::ut_detail::default_char_compare<char>,boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>,boost::iterators::forward_traversal_tag>
           )0x0) {
        return false;
      }
      this[0x58] = (token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,boost::unit_test::utils::ut_detail::default_char_compare<char>>,char,boost::unit_test::utils::ut_detail::default_char_compare<char>,boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>,boost::iterators::forward_traversal_tag>
                    )0x1;
    }
    bVar2 = ut_detail::
            delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>::
            operator()((delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                        *)(this + 0x30),*pcVar4);
    tVar1 = this[0x58];
    if (bVar2) {
      if (tVar1 != (token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,boost::unit_test::utils::ut_detail::default_char_compare<char>>,char,boost::unit_test::utils::ut_detail::default_char_compare<char>,boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>,boost::iterators::forward_traversal_tag>
                    )0x0) {
        *begin = *begin + 1;
      }
      this[0x58] = (token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,boost::unit_test::utils::ut_detail::default_char_compare<char>>,char,boost::unit_test::utils::ut_detail::default_char_compare<char>,boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>,boost::iterators::forward_traversal_tag>
                    )((byte)tVar1 ^ 1);
    }
    else {
      if ((tVar1 != (token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,boost::unit_test::utils::ut_detail::default_char_compare<char>>,char,boost::unit_test::utils::ut_detail::default_char_compare<char>,boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>,boost::iterators::forward_traversal_tag>
                     )0x0) ||
         (bVar2 = ut_detail::
                  delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                  ::operator()((delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                                *)(this + 0x18),**begin), !bVar2)) {
        bVar2 = ut_detail::
                delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                ::operator()((delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                              *)(this + 0x18),**begin);
        pcVar3 = *begin;
        if (bVar2) {
          pcVar3 = pcVar3 + 1;
          *begin = pcVar3;
          pcVar4 = pcVar3;
        }
        while (((pcVar3 != end &&
                (bVar2 = ut_detail::
                         delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                         ::operator()((delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                                       *)(this + 0x18),*pcVar3), !bVar2)) &&
               (bVar2 = ut_detail::
                        delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                        ::operator()((delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
                                      *)(this + 0x30),**begin), !bVar2))) {
          pcVar3 = *begin + 1;
          *begin = pcVar3;
        }
      }
      this[0x58] = (token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,boost::unit_test::utils::ut_detail::default_char_compare<char>>,char,boost::unit_test::utils::ut_detail::default_char_compare<char>,boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>,boost::iterators::forward_traversal_tag>
                    )0x1;
    }
  }
  pcVar3 = *begin;
  *(char **)(this + 8) = pcVar4;
  *(char **)(this + 0x10) = pcVar3;
  return true;
}

Assistant:

bool                    get( Iter& begin, Iter end )
    {
        typedef ut_detail::token_assigner<BOOST_DEDUCED_TYPENAME iterator_traversal<Iter>::type> Assigner;
        Iter check_point;

        this->m_value.clear();

        if( !m_keep_empty_tokens ) {
            while( begin != end && m_is_dropped( *begin ) )
                ++begin;

            if( begin == end )
                return false;

            check_point = begin;

            if( m_tokens_left == 1 )
                while( begin != end )
                    Assigner::append_move( begin, this->m_value );
            else if( m_is_kept( *begin ) )
                Assigner::append_move( begin, this->m_value );
            else
                while( begin != end && !m_is_dropped( *begin ) && !m_is_kept( *begin ) )
                    Assigner::append_move( begin, this->m_value );

            --m_tokens_left;
        }
        else { // m_keep_empty_tokens is true
            check_point = begin;

            if( begin == end ) {
                if( m_token_produced )
                    return false;

                m_token_produced = true;
            }
            if( m_is_kept( *begin ) ) {
                if( m_token_produced )
                    Assigner::append_move( begin, this->m_value );

                m_token_produced = !m_token_produced;
            }
            else if( !m_token_produced && m_is_dropped( *begin ) )
                m_token_produced = true;
            else {
                if( m_is_dropped( *begin ) )
                    check_point = ++begin;

                while( begin != end && !m_is_dropped( *begin ) && !m_is_kept( *begin ) )
                    Assigner::append_move( begin, this->m_value );

                m_token_produced = true;
            }
        }

        Assigner::assign( check_point, begin, this->m_value );

        return true;
    }